

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O3

bool __thiscall duckdb_re2::RE2::PossibleMatchRange(RE2 *this,string *min,string *max,int maxlen)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  char cVar3;
  pointer pcVar4;
  string *prefix;
  bool bVar5;
  int i;
  long lVar6;
  int iVar7;
  string dmin;
  string dmax;
  string local_78;
  string *local_58;
  string local_50;
  
  if (this->prog_ != (Prog *)0x0) {
    iVar7 = (int)(this->prefix_)._M_string_length;
    if (maxlen <= iVar7) {
      iVar7 = maxlen;
    }
    local_58 = max;
    std::__cxx11::string::substr((ulong)&local_78,(ulong)&this->prefix_);
    std::__cxx11::string::operator=((string *)min,(string *)&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p);
    }
    std::__cxx11::string::substr((ulong)&local_78,(ulong)&this->prefix_);
    prefix = local_58;
    std::__cxx11::string::operator=((string *)local_58,(string *)&local_78);
    paVar1 = &local_78.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != paVar1) {
      operator_delete(local_78._M_dataplus._M_p);
    }
    if ((*(int *)&this->field_0x44 < 0) && (0 < iVar7)) {
      lVar6 = 0;
      do {
        pcVar4 = (min->_M_dataplus)._M_p;
        cVar3 = pcVar4[lVar6];
        if ((byte)(cVar3 + 0x9fU) < 0x1a) {
          pcVar4[lVar6] = cVar3 + -0x20;
        }
        lVar6 = lVar6 + 1;
      } while (iVar7 != lVar6);
    }
    local_78._M_string_length = 0;
    local_78.field_2._M_local_buf[0] = '\0';
    paVar2 = &local_50.field_2;
    local_50._M_string_length = 0;
    local_50.field_2._M_local_buf[0] = '\0';
    local_78._M_dataplus._M_p = (pointer)paVar1;
    local_50._M_dataplus._M_p = (pointer)paVar2;
    if ((maxlen - iVar7 == 0 || maxlen < iVar7) ||
       (bVar5 = Prog::PossibleMatchRange(this->prog_,&local_78,&local_50,maxlen - iVar7), !bVar5)) {
      if (prefix->_M_string_length == 0) {
        std::__cxx11::string::_M_replace((ulong)min,0,(char *)min->_M_string_length,0x1480643);
        bVar5 = false;
        std::__cxx11::string::_M_replace((ulong)prefix,0,(char *)prefix->_M_string_length,0x1480643)
        ;
      }
      else {
        bVar5 = true;
        PrefixSuccessor(prefix);
      }
    }
    else {
      std::__cxx11::string::_M_append((char *)min,(ulong)local_78._M_dataplus._M_p);
      bVar5 = true;
      std::__cxx11::string::_M_append((char *)prefix,(ulong)local_50._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != paVar1) {
      operator_delete(local_78._M_dataplus._M_p);
    }
    return bVar5;
  }
  return false;
}

Assistant:

bool RE2::PossibleMatchRange(std::string* min, std::string* max,
                             int maxlen) const {
  if (prog_ == NULL)
    return false;

  int n = static_cast<int>(prefix_.size());
  if (n > maxlen)
    n = maxlen;

  // Determine initial min max from prefix_ literal.
  *min = prefix_.substr(0, n);
  *max = prefix_.substr(0, n);
  if (prefix_foldcase_) {
    // prefix is ASCII lowercase; change *min to uppercase.
    for (int i = 0; i < n; i++) {
      char& c = (*min)[i];
      if ('a' <= c && c <= 'z')
        c += 'A' - 'a';
    }
  }

  // Add to prefix min max using PossibleMatchRange on regexp.
  std::string dmin, dmax;
  maxlen -= n;
  if (maxlen > 0 && prog_->PossibleMatchRange(&dmin, &dmax, maxlen)) {
    min->append(dmin);
    max->append(dmax);
  } else if (!max->empty()) {
    // prog_->PossibleMatchRange has failed us,
    // but we still have useful information from prefix_.
    // Round up *max to allow any possible suffix.
    PrefixSuccessor(max);
  } else {
    // Nothing useful.
    *min = "";
    *max = "";
    return false;
  }

  return true;
}